

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O2

void __thiscall
RandomWordTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>::populate
          (RandomWordTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> *this)

{
  vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  *this_00;
  pointer pwVar1;
  pointer pvVar2;
  uint uVar3;
  result_type rVar4;
  size_t length;
  ulong local_1408;
  uniform_int_distribution<unsigned_int> word_length_distribution;
  uniform_int_distribution<unsigned_int> word_count_distribution;
  _Vector_base<wchar_t,_std::allocator<wchar_t>_> local_13e8;
  _Vector_base<wchar_t,_std::allocator<wchar_t>_> local_13d0;
  mt19937 randgen;
  
  this_00 = &this->m_tokens;
  std::
  vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  ::clear(this_00);
  pwVar1 = (this->m_str).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_str).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
      super__Vector_impl_data._M_finish != pwVar1) {
    (this->m_str).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
    super__Vector_impl_data._M_finish = pwVar1;
  }
  uVar3 = std::chrono::_V2::system_clock::now();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&randgen,(ulong)uVar3);
  word_count_distribution._M_param._M_a = 5;
  word_count_distribution._M_param._M_b = 0x40;
  word_length_distribution._M_param._M_a = 0;
  word_length_distribution._M_param._M_b = 0x10;
  local_1408 = this->m_fixed_word_count;
  if (local_1408 == 0) {
    rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                      (&word_count_distribution,&randgen);
    local_1408 = (ulong)rVar4;
  }
  while ((ulong)(((long)(this->m_tokens).
                        super__Vector_base<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_tokens).
                       super__Vector_base<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18) < local_1408) {
    length = this->m_fixed_word_length;
    if (length == 0) {
      rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                        (&word_length_distribution,&randgen);
      length = (size_t)rVar4;
    }
    std::vector<wchar_t,_std::allocator<wchar_t>_>::vector
              ((vector<wchar_t,_std::allocator<wchar_t>_> *)&local_13d0,&this->m_delim);
    make_word<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::vector<wchar_t,_std::allocator<wchar_t>_>,_nullptr>
              ((vector<wchar_t,_std::allocator<wchar_t>_> *)&local_13e8,
               (vector<wchar_t,_std::allocator<wchar_t>_> *)&local_13d0,length);
    std::
    vector<std::vector<wchar_t,std::allocator<wchar_t>>,std::allocator<std::vector<wchar_t,std::allocator<wchar_t>>>>
    ::emplace_back<std::vector<wchar_t,std::allocator<wchar_t>>>
              ((vector<std::vector<wchar_t,std::allocator<wchar_t>>,std::allocator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                *)this_00,(vector<wchar_t,_std::allocator<wchar_t>_> *)&local_13e8);
    std::_Vector_base<wchar_t,_std::allocator<wchar_t>_>::~_Vector_base(&local_13e8);
    std::_Vector_base<wchar_t,_std::allocator<wchar_t>_>::~_Vector_base(&local_13d0);
    pvVar2 = (this->m_tokens).
             super__Vector_base<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar2[-1].super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
        super__Vector_impl_data._M_start ==
        pvVar2[-1].super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::
      vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
      ::pop_back(this_00);
    }
    else {
      local_13e8._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)(this->m_str).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_str).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&this->m_token_indexes,(unsigned_long *)&local_13e8);
      pvVar2 = (this->m_tokens).
               super__Vector_base<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      std::vector<wchar_t,std::allocator<wchar_t>>::
      insert<__gnu_cxx::__normal_iterator<wchar_t*,std::vector<wchar_t,std::allocator<wchar_t>>>,void>
                ((vector<wchar_t,std::allocator<wchar_t>> *)&this->m_str,
                 (const_iterator)
                 (this->m_str).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
                 pvVar2[-1].super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
                 pvVar2[-1].super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    std::vector<wchar_t,std::allocator<wchar_t>>::
    insert<__gnu_cxx::__normal_iterator<wchar_t*,std::vector<wchar_t,std::allocator<wchar_t>>>,void>
              ((vector<wchar_t,std::allocator<wchar_t>> *)&this->m_str,
               (const_iterator)
               (this->m_str).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
               (this->m_delim).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
               (this->m_delim).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void populate() {
		m_tokens.clear();
		m_str.clear();

		std::mt19937 randgen(static_cast<unsigned int>(std::chrono::system_clock::now().time_since_epoch().count()));
		std::uniform_int_distribution<uint32_t> word_count_distribution(5, 64);
		std::uniform_int_distribution<uint32_t> word_length_distribution(0, 16);

		auto word_count = m_fixed_word_count;
		if (word_count == 0) {
			word_count = word_count_distribution(randgen);
		}

		while (m_tokens.size() < word_count) {
			auto word_length = m_fixed_word_length;
			if (word_length == 0) {
				word_length = word_length_distribution(randgen);
			}
			m_tokens.push_back(make_word<T, StringT>(m_delim, word_length));
			if (m_tokens.back().empty()) {
				m_tokens.pop_back();
			}
			else {
				m_token_indexes.push_back(m_str.size());
				m_str.insert(m_str.end(), m_tokens.back().begin(), m_tokens.back().end());
			}
			m_str.insert(m_str.end(), m_delim.begin(), m_delim.end());
		}
	}